

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O3

int ptrstr(void)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  char *__dest;
  char local_49;
  char animal [20];
  
  builtin_strncpy(animal,"bear",5);
  animal[5] = '\0';
  animal[6] = '\0';
  animal[7] = '\0';
  animal[8] = '\0';
  animal[9] = '\0';
  animal[10] = '\0';
  animal[0xb] = '\0';
  animal[0xc] = '\0';
  animal[0xd] = '\0';
  animal[0xe] = '\0';
  animal[0xf] = '\0';
  animal[0x10] = '\0';
  animal[0x11] = '\0';
  animal[0x12] = '\0';
  animal[0x13] = '\0';
  sVar4 = strlen(animal);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,animal,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wren",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_49,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"input a kind of animal:",0x17);
  lVar1 = *(long *)(std::getline<char,std::char_traits<char>,std::allocator<char>> +
                   *(long *)(std::cin + -0x18));
  std::__istream_extract((istream *)&std::cin,animal,0x14);
  if (((*(int *)(cos + *(long *)(std::cin + -0x18)) == 0) && (lVar1 - 0x15U < 0xffffffffffffffec))
     && (plVar2 = *(long **)(*(long *)(std::cin + -0x18) + 0x136510),
        (ulong)plVar2[3] <= (ulong)plVar2[2])) {
    iVar3 = (**(code **)(*plVar2 + 0x48))();
    if (iVar3 == -1) {
      std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x136428);
    }
  }
  sVar4 = strlen(animal);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,animal,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"before using strcpy(): \n",0x18);
  sVar4 = strlen(animal);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,animal,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
  poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  sVar4 = strlen(animal);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,animal,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
  poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  sVar4 = strlen(animal);
  __dest = (char *)operator_new__(sVar4 + 1);
  strcpy(__dest,animal);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"after using strcpy(): \n",0x17);
  sVar4 = strlen(animal);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,animal,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
  poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  sVar4 = strlen(__dest);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__dest,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
  poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  operator_delete__(__dest);
}

Assistant:

int ptrstr () {
    using namespace std;
    char animal[20] = "bear";
    const char * bird = "wren";
    char * ps;

    cout << animal << " and " << bird << "\n";
    cout << *ps << endl; // uninitialized values
    cout << "input a kind of animal:";
    cin >> animal;
    ps = animal;
    cout << ps << "!\n";

    cout << "before using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;

    //  new address
    ps = new char[strlen(animal) + 1];
    //  copy value to the newly created address
    strcpy(ps, animal);
    cout << "after using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;
    delete [] ps;

    return 0;
}